

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

Container * __thiscall
IceCore::Container::FindNext(Container *this,udword *entry,FindMode find_mode)

{
  uint uVar1;
  udword *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->mCurNbEntries;
  uVar5 = (ulong)uVar1;
  if (uVar5 != 0) {
    puVar2 = this->mEntries;
    uVar3 = 1;
    if (*puVar2 != *entry) {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        if (uVar5 == uVar6) {
          return this;
        }
        uVar3 = uVar6 + 1;
      } while (puVar2[uVar6] != *entry);
      if (uVar5 <= uVar6) {
        return this;
      }
    }
    uVar4 = 0;
    if (find_mode != FIND_WRAP) {
      uVar4 = uVar1 - 1;
    }
    uVar5 = (ulong)uVar4;
    if ((uint)uVar3 != uVar1) {
      uVar5 = uVar3 & 0xffffffff;
    }
    *entry = puVar2[uVar5];
  }
  return this;
}

Assistant:

Container& Container::FindNext(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location++;
		if(Location==mCurNbEntries)	Location = find_mode==FIND_WRAP ? 0 : mCurNbEntries-1;
		entry = mEntries[Location];
	}
	return *this;
}